

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void loadCPP(pixels *p,string *filename,bool tiled,int fw,int fh,int dwx,int dwy)

{
  int iVar1;
  Vec2 *pVVar2;
  Slice *pSVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000011;
  long lVar8;
  ulong uVar9;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar10;
  V2i origin;
  InputFile in;
  FrameBuffer fb;
  undefined1 local_68 [56];
  
  pcVar5 = (filename->_M_dataplus)._M_p;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(&in,pcVar5,iVar4);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar2 = (Vec2 *)(p->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar4 = p->_stride_x;
  origin.x = fh;
  origin.y = dwx;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  iVar1 = *(int *)(lVar6 + 4);
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  lVar8 = (long)(int)CONCAT71(in_register_00000011,tiled);
  uVar9 = (ulong)fw;
  Imf_3_4::Slice::Make
            ((PixelType)local_68,(void *)0x0,pVVar2,(long)&origin,lVar8,uVar9,0,iVar4 << 2,iVar1,0.0
             ,SUB41(*(undefined4 *)(lVar6 + 8),0),false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x31d35b);
  pVVar2 = (Vec2 *)(p->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  iVar4 = p->_stride_x;
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  iVar1 = *(int *)(lVar6 + 4);
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  Imf_3_4::Slice::Make
            ((PixelType)local_68,(void *)0x1,pVVar2,(long)&origin,lVar8,uVar9,0,iVar4 * 2,iVar1,0.0,
             SUB41(*(undefined4 *)(lVar6 + 8),0),false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x154bdc);
  pvVar10 = p->rgba;
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    pSVar3 = *(Slice **)((long)channels + lVar6);
    pVVar2 = (Vec2 *)(pvVar10->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start;
    iVar4 = p->_stride_x;
    Imf_3_4::InputFile::header();
    pcVar5 = (char *)Imf_3_4::Header::channels();
    lVar7 = Imf_3_4::ChannelList::operator[](pcVar5);
    iVar1 = *(int *)(lVar7 + 4);
    Imf_3_4::InputFile::header();
    pcVar5 = (char *)Imf_3_4::Header::channels();
    lVar7 = Imf_3_4::ChannelList::operator[](pcVar5);
    Imf_3_4::Slice::Make
              ((PixelType)local_68,(void *)0x1,pVVar2,(long)&origin,lVar8,uVar9,0,iVar4 * 2,iVar1,
               0.0,SUB41(*(undefined4 *)(lVar7 + 8),0),false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,pSVar3);
    pvVar10 = pvVar10 + 1;
  }
  pVVar2 = (Vec2 *)(p->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar4 = p->_stride_x;
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  iVar1 = *(int *)(lVar6 + 4);
  Imf_3_4::InputFile::header();
  pcVar5 = (char *)Imf_3_4::Header::channels();
  lVar6 = Imf_3_4::ChannelList::operator[](pcVar5);
  Imf_3_4::Slice::Make
            ((PixelType)local_68,(void *)0x2,pVVar2,(long)&origin,lVar8,uVar9,0,iVar4 << 2,iVar1,0.0
             ,SUB41(*(undefined4 *)(lVar6 + 8),0),false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x31d3b5);
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&in);
  Imf_3_4::InputFile::readPixels((int)&in,dwx);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  Imf_3_4::InputFile::~InputFile(&in);
  return;
}

Assistant:

static void
loadCPP (
    pixels&            p,
    const std::string& filename,
    bool               tiled,
    int                fw,
    int                fh,
    int                dwx,
    int                dwy)
{
    InputFile in (filename.c_str ());
    {
        FrameBuffer fb;
        V2i         origin{dwx, dwy};
        fb.insert (
            "I",
            Slice::Make (
                IMF::UINT,
                p.i.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                in.header ().channels ()["I"].xSampling,
                in.header ().channels ()["I"].ySampling,
                0.0,
                false,
                false));
        fb.insert (
            "H",
            Slice::Make (
                IMF::HALF,
                p.h.data (),
                origin,
                fw,
                fh,
                0,
                2 * p._stride_x,
                in.header ().channels ()["H"].xSampling,
                in.header ().channels ()["H"].ySampling,
                0.0,
                false,
                false));

        for (int c = 0; c < 4; c++)
        {
            fb.insert (
                channels[c],
                Slice::Make (
                    IMF::HALF,
                    p.rgba[c].data (),
                    origin,
                    fw,
                    fh,
                    0,
                    2 * p._stride_x,
                    in.header ().channels ()[channels[c]].xSampling,
                    in.header ().channels ()[channels[c]].ySampling,
                    0.0,
                    false,
                    false));
        }
        fb.insert (
            "F",
            Slice::Make (
                IMF::FLOAT,
                p.f.data (),
                origin,
                fw,
                fh,
                0,
                4 * p._stride_x,
                in.header ().channels ()["F"].xSampling,
                in.header ().channels ()["F"].ySampling,
                0.0,
                false,
                false));

        in.setFrameBuffer (fb);
        in.readPixels (dwy, dwy + fh - 1);
    }
}